

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O2

bool __thiscall wallet::CWallet::MarkReplaced(CWallet *this,uint256 *originalHash,uint256 *newHash)

{
  CWalletTx *tx;
  bool bVar1;
  iterator iVar2;
  size_type sVar3;
  mapped_type *this_00;
  Chain *chain;
  WalletDatabase *pWVar4;
  long in_FS_OFFSET;
  allocator<char> local_89;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock21;
  key_type local_78;
  key_type local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock21,&this->cs_wallet,"cs_wallet",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
             ,0x3db,false);
  iVar2 = std::
          _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->mapWallet)._M_h,originalHash);
  if (iVar2.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur ==
      (__node_type *)0x0) {
    __assert_fail("mi != mapWallet.end()",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                  ,0x3e0,"bool wallet::CWallet::MarkReplaced(const uint256 &, const uint256 &)");
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_58,"replaced_by_txid",(allocator<char> *)&local_78);
  tx = (CWalletTx *)
       ((long)iVar2.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>.
              _M_cur + 0x28);
  sVar3 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::count((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)tx,&local_58);
  if (sVar3 == 0) {
    std::__cxx11::string::~string((string *)&local_58);
    base_blob<256u>::ToString_abi_cxx11_(&local_58,(base_blob<256u> *)newHash);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"replaced_by_txid",&local_89);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)tx,&local_78);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
              (this_00,&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_58);
    chain = CWallet::chain(this);
    RefreshMempoolStatus(tx,chain);
    pWVar4 = GetDatabase(this);
    (*pWVar4->_vptr_WalletDatabase[0xe])(&local_78,pWVar4,1);
    local_78._M_string_length = (size_type)pWVar4;
    bVar1 = WalletBatch::WriteTx((WalletBatch *)&local_78,tx);
    if (!bVar1) {
      base_blob<256u>::ToString_abi_cxx11_
                (&local_58,
                 (base_blob<256u> *)
                 (*(long *)((long)iVar2.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x1c0) + 0x39));
      WalletLogPrintf<char[13],std::__cxx11::string>
                (this,(ConstevalFormatString<2U>)0xe0654d,(char (*) [13])"MarkReplaced",&local_58);
      std::__cxx11::string::~string((string *)&local_58);
    }
    boost::signals2::
    signal<void_(const_uint256_&,_ChangeType),_boost::signals2::optional_last_value<void>,_int,_std::less<int>,_boost::function<void_(const_uint256_&,_ChangeType)>,_boost::function<void_(const_boost::signals2::connection_&,_const_uint256_&,_ChangeType)>,_boost::signals2::mutex>
    ::operator()(&this->NotifyTransactionChanged,originalHash,CT_UPDATED);
    if ((long *)local_78._M_dataplus._M_p != (long *)0x0) {
      (**(code **)(*(long *)local_78._M_dataplus._M_p + 0x28))();
    }
    std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock21.super_unique_lock);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return bVar1;
    }
    __stack_chk_fail();
  }
  __assert_fail("wtx.mapValue.count(\"replaced_by_txid\") == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/wallet.cpp"
                ,0x3e5,"bool wallet::CWallet::MarkReplaced(const uint256 &, const uint256 &)");
}

Assistant:

bool CWallet::MarkReplaced(const uint256& originalHash, const uint256& newHash)
{
    LOCK(cs_wallet);

    auto mi = mapWallet.find(originalHash);

    // There is a bug if MarkReplaced is not called on an existing wallet transaction.
    assert(mi != mapWallet.end());

    CWalletTx& wtx = (*mi).second;

    // Ensure for now that we're not overwriting data
    assert(wtx.mapValue.count("replaced_by_txid") == 0);

    wtx.mapValue["replaced_by_txid"] = newHash.ToString();

    // Refresh mempool status without waiting for transactionRemovedFromMempool or transactionAddedToMempool
    RefreshMempoolStatus(wtx, chain());

    WalletBatch batch(GetDatabase());

    bool success = true;
    if (!batch.WriteTx(wtx)) {
        WalletLogPrintf("%s: Updating batch tx %s failed\n", __func__, wtx.GetHash().ToString());
        success = false;
    }

    NotifyTransactionChanged(originalHash, CT_UPDATED);

    return success;
}